

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_multi_closed(connectdata *conn,curl_socket_t s)

{
  Curl_multi *pCVar1;
  undefined8 in_RAX;
  void *pvVar2;
  curl_socket_t local_28;
  curl_socket_t local_24;
  
  pCVar1 = conn->data->multi;
  if (pCVar1 != (Curl_multi *)0x0) {
    _local_28 = CONCAT44((curl_socket_t)((ulong)in_RAX >> 0x20),s);
    if (s == -1) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = Curl_hash_pick(&pCVar1->sockhash,&local_28,4);
    }
    if (pvVar2 != (void *)0x0) {
      if (pCVar1->socket_cb != (curl_socket_callback)0x0) {
        (*pCVar1->socket_cb)(conn->data,s,4,pCVar1->socket_userp,*(void **)((long)pvVar2 + 0x10));
      }
      _local_28 = CONCAT44(s,local_28);
      Curl_hash_delete(&pCVar1->sockhash,&local_24,4);
    }
  }
  return;
}

Assistant:

void Curl_multi_closed(struct connectdata *conn, curl_socket_t s)
{
  struct Curl_multi *multi = conn->data->multi;
  if(multi) {
    /* this is set if this connection is part of a handle that is added to
       a multi handle, and only then this is necessary */
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(entry) {
      if(multi->socket_cb)
        multi->socket_cb(conn->data, s, CURL_POLL_REMOVE,
                         multi->socket_userp,
                         entry->socketp);

      /* now remove it from the socket hash */
      sh_delentry(&multi->sockhash, s);
    }
  }
}